

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int jsonEachBestIndex(sqlite3_vtab *tab,sqlite3_index_info *pIdxInfo)

{
  uint uVar1;
  int *in_RSI;
  long in_FS_OFFSET;
  int iMask;
  int iCol;
  sqlite3_index_constraint *pConstraint;
  int idxMask;
  int unusableMask;
  int i;
  int aIdx [2];
  int *local_40;
  uint local_34;
  uint local_30;
  int local_2c;
  int local_14;
  int local_10 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = 0;
  local_34 = 0;
  local_10[1] = -1;
  local_10[0] = -1;
  local_40 = *(int **)(in_RSI + 2);
  for (local_2c = 0; local_2c < *in_RSI; local_2c = local_2c + 1) {
    if (7 < *local_40) {
      uVar1 = 1 << ((byte)(*local_40 + -8) & 0x1f);
      if (*(char *)((long)local_40 + 5) == '\0') {
        local_30 = uVar1 | local_30;
      }
      else if ((char)local_40[1] == '\x02') {
        local_10[*local_40 + -8] = local_2c;
        local_34 = uVar1 | local_34;
      }
    }
    local_40 = local_40 + 3;
  }
  if (((0 < in_RSI[4]) && (**(int **)(in_RSI + 6) < 0)) &&
     (*(char *)(*(long *)(in_RSI + 6) + 4) == '\0')) {
    in_RSI[0xf] = 1;
  }
  if ((local_30 & (local_34 ^ 0xffffffff)) == 0) {
    if (local_10[0] < 0) {
      in_RSI[10] = 0;
    }
    else {
      in_RSI[0x10] = 0;
      in_RSI[0x11] = 0x3ff00000;
      *(undefined4 *)(*(long *)(in_RSI + 8) + (long)local_10[0] * 8) = 1;
      *(undefined1 *)(*(long *)(in_RSI + 8) + 4 + (long)local_10[0] * 8) = 1;
      if (local_10[1] < 0) {
        in_RSI[10] = 1;
      }
      else {
        *(undefined4 *)(*(long *)(in_RSI + 8) + (long)local_10[1] * 8) = 2;
        *(undefined1 *)(*(long *)(in_RSI + 8) + 4 + (long)local_10[1] * 8) = 1;
        in_RSI[10] = 3;
      }
    }
    local_14 = 0;
  }
  else {
    local_14 = 0x13;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_14;
}

Assistant:

static int jsonEachBestIndex(
  sqlite3_vtab *tab,
  sqlite3_index_info *pIdxInfo
){
  int i;                     /* Loop counter or computed array index */
  int aIdx[2];               /* Index of constraints for JSON and ROOT */
  int unusableMask = 0;      /* Mask of unusable JSON and ROOT constraints */
  int idxMask = 0;           /* Mask of usable == constraints JSON and ROOT */
  const struct sqlite3_index_constraint *pConstraint;

  /* This implementation assumes that JSON and ROOT are the last two
  ** columns in the table */
  assert( JEACH_ROOT == JEACH_JSON+1 );
  UNUSED_PARAMETER(tab);
  aIdx[0] = aIdx[1] = -1;
  pConstraint = pIdxInfo->aConstraint;
  for(i=0; i<pIdxInfo->nConstraint; i++, pConstraint++){
    int iCol;
    int iMask;
    if( pConstraint->iColumn < JEACH_JSON ) continue;
    iCol = pConstraint->iColumn - JEACH_JSON;
    assert( iCol==0 || iCol==1 );
    testcase( iCol==0 );
    iMask = 1 << iCol;
    if( pConstraint->usable==0 ){
      unusableMask |= iMask;
    }else if( pConstraint->op==SQLITE_INDEX_CONSTRAINT_EQ ){
      aIdx[iCol] = i;
      idxMask |= iMask;
    }
  }
  if( pIdxInfo->nOrderBy>0
   && pIdxInfo->aOrderBy[0].iColumn<0
   && pIdxInfo->aOrderBy[0].desc==0
  ){
    pIdxInfo->orderByConsumed = 1;
  }

  if( (unusableMask & ~idxMask)!=0 ){
    /* If there are any unusable constraints on JSON or ROOT, then reject
    ** this entire plan */
    return SQLITE_CONSTRAINT;
  }
  if( aIdx[0]<0 ){
    /* No JSON input.  Leave estimatedCost at the huge value that it was
    ** initialized to to discourage the query planner from selecting this
    ** plan. */
    pIdxInfo->idxNum = 0;
  }else{
    pIdxInfo->estimatedCost = 1.0;
    i = aIdx[0];
    pIdxInfo->aConstraintUsage[i].argvIndex = 1;
    pIdxInfo->aConstraintUsage[i].omit = 1;
    if( aIdx[1]<0 ){
      pIdxInfo->idxNum = 1;  /* Only JSON supplied.  Plan 1 */
    }else{
      i = aIdx[1];
      pIdxInfo->aConstraintUsage[i].argvIndex = 2;
      pIdxInfo->aConstraintUsage[i].omit = 1;
      pIdxInfo->idxNum = 3;  /* Both JSON and ROOT are supplied.  Plan 3 */
    }
  }
  return SQLITE_OK;
}